

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_runner.h
# Opt level: O2

bool __thiscall
cute::runner<cute::ide_listener<cute::null_listener>_>::runit
          (runner<cute::ide_listener<cute::null_listener>_> *this,test *t)

{
  ide_listener<cute::null_listener>::start(this->listener,t);
  std::function<void_()>::operator()(&t->theTest);
  ide_listener<cute::null_listener>::success(this->listener,t,"OK");
  return true;
}

Assistant:

bool runit(const test & t) const
	    {
	        try {
	            listener.start(t);
	            t();
	            listener.success(t, "OK");
	            return true;
	        } catch(const cute::test_failure & e){
	            listener.failure(t, e);
	        } catch(const std::exception & exc){
	            listener.error(t, demangle(exc.what()).c_str());
	        } catch(std::string & s){
	            listener.error(t, s.c_str());
	        } catch(const char *&cs) {
				listener.error(t,cs);
			} catch(...) {
				listener.error(t,"unknown exception thrown");
			}
			return false;
		}